

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

FunctionValue *
CreateGenericFunctionInstance
          (FunctionValue *__return_storage_ptr__,ExpressionContext *ctx,SynBase *source,
          FunctionValue proto,IntrusiveList<TypeHandle> generics,ArrayView<ArgumentData> arguments,
          bool standalone)

{
  __jmp_buf_tag *__env;
  uint uVar1;
  Allocator *pAVar2;
  SynIdentifier *pSVar3;
  TypeBase *pTVar4;
  FunctionData *pFVar5;
  ScopeData *pSVar6;
  TypeHandle *pTVar7;
  Lexeme *pLVar8;
  long lVar9;
  long lVar10;
  ExprVariableDefinition *node;
  char *pcVar11;
  char *pcVar12;
  ExprBase **ppEVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  IntrusiveList<MatchData> matches;
  bool bVar16;
  int iVar17;
  ScopeData *parentType;
  undefined4 extraout_var;
  TypeFunction *argumentType;
  size_t sVar19;
  char *pcVar20;
  SynFunctionDefinition *syntax;
  ExprBase *pEVar21;
  SynBase *pSVar22;
  TypeHandle *pTVar23;
  char *pcVar24;
  ulong uVar25;
  uint uVar26;
  MatchData *pMVar27;
  SynShortFunctionDefinition *syntax_00;
  TypeHandle *pTVar28;
  ExprBase *pEVar29;
  int iVar30;
  ulong uVar31;
  ArrayView<ArgumentData> functionArguments;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<CallArgumentData> arguments_01;
  IntrusiveList<MatchData> aliases;
  TraceScope traceScope;
  SmallArray<CallArgumentData,_16U> result;
  jmp_buf prevErrorHandler;
  IntrusiveList<MatchData> local_248;
  ExprBase *local_230;
  char *local_228;
  TraceScope local_220;
  SmallArray<CallArgumentData,_16U> local_210;
  undefined1 local_f8 [200];
  MatchData *pMVar18;
  
  pTVar23 = generics.head;
  pAVar2 = ctx->allocator;
  memset(local_210.little,0,0x100);
  local_210.count = 0;
  local_210.max = 0x10;
  uVar14 = ((proto.function)->arguments).data;
  uVar15 = ((proto.function)->arguments).count;
  functionArguments.count = uVar15;
  functionArguments.data = (ArgumentData *)uVar14;
  functionArguments._12_4_ = 0;
  arguments_00._12_4_ = 0;
  arguments_00.data = (ArgumentData *)SUB128(arguments._0_12_,0);
  arguments_00.count = SUB124(arguments._0_12_,8);
  local_210.data = local_210.little;
  local_210.allocator = pAVar2;
  bVar16 = PrepareArgumentsForFunctionCall
                     (ctx,source,functionArguments,arguments_00,&local_210,(uint *)0x0,false);
  if (!bVar16) {
    __assert_fail("!\"unexpected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1ab6,
                  "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                 );
  }
  parentType = (ScopeData *)(proto.function)->scope->ownerType;
  if ((TypeStruct *)(proto.context)->type == ctx->typeAutoRef) {
    if ((parentType == (ScopeData *)0x0) || (*(bool *)((long)&parentType->startOffset + 4) == true))
    {
      __assert_fail("function->scope->ownerType && !function->scope->ownerType->isGeneric",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1abc,
                    "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
  }
  else if (parentType == (ScopeData *)0x0) {
    parentType = (ScopeData *)0x0;
  }
  else {
    parentType = ((TypeStruct *)(proto.context)->type)->typeScope;
  }
  local_230 = proto.context;
  if ((parentType != (ScopeData *)0x0) && (*(bool *)((long)&parentType->startOffset + 4) == true)) {
    anon_unknown.dwarf_c6b42::Stop
              (ctx,source,"ERROR: generic type arguments required for type \'%.*s\'",
               (ulong)(uint)(*(int *)&parentType->ownerFunction -
                            (int)((InplaceStr *)&parentType->ownerNamespace)->begin));
  }
  local_248.head = (MatchData *)0x0;
  local_248.tail = (MatchData *)0x0;
  pMVar27 = ((proto.function)->generics).head;
  if (pTVar23 != (TypeHandle *)0x0 && pMVar27 != (MatchData *)0x0) {
    pTVar28 = pTVar23;
    do {
      if ((pTVar28->type != (TypeBase *)0x0) && (pTVar28->type->typeID == 0)) goto LAB_00161532;
      iVar17 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pMVar18 = (MatchData *)CONCAT44(extraout_var,iVar17);
      pSVar3 = pMVar27->name;
      pTVar4 = pTVar28->type;
      pMVar18->name = pSVar3;
      pMVar18->type = pTVar4;
      pMVar18->next = (MatchData *)0x0;
      pMVar18->listed = false;
      if (pSVar3 == (SynIdentifier *)0x0) {
        __assert_fail("name",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                      ,0xf6,"MatchData::MatchData(SynIdentifier *, TypeBase *)");
      }
      IntrusiveList<MatchData>::push_back(&local_248,pMVar18);
      pMVar27 = pMVar27->next;
    } while ((pMVar27 != (MatchData *)0x0) &&
            (pTVar28 = pTVar28->next, pTVar28 != (TypeHandle *)0x0));
  }
  arguments_01.count = local_210.count;
  arguments_01.data = local_210.data;
  arguments_01._12_4_ = 0;
  argumentType = GetGenericFunctionInstanceType
                           (ctx,source,(TypeBase *)parentType,proto.function,arguments_01,&local_248
                           );
  if (argumentType == (TypeFunction *)0x0) {
    anon_unknown.dwarf_c6b42::Report
              (ctx,source,"ERROR: failed to instantiate generic function \'%.*s\'",
               (ulong)(uint)(*(int *)&((proto.function)->name->name).end -
                            (int)((proto.function)->name->name).begin));
LAB_00161532:
    __return_storage_ptr__->source = (SynBase *)0x0;
    __return_storage_ptr__->function = (FunctionData *)0x0;
    __return_storage_ptr__->context = (ExprBase *)0x0;
    goto LAB_00161852;
  }
  if ((argumentType->super_TypeBase).isGeneric != false) {
    __assert_fail("!instance->isGeneric",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1adf,
                  "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                 );
  }
  uVar31 = (ulong)((proto.function)->instances).count;
  if (uVar31 != 0) {
    uVar25 = 0;
    do {
      pFVar5 = ((proto.function)->instances).data[uVar25];
      pSVar6 = (ScopeData *)pFVar5->scope->ownerType;
      if (parentType == pSVar6) {
        pMVar27 = (pFVar5->generics).head;
        iVar30 = 0;
        iVar17 = 0;
        if (pMVar27 != (MatchData *)0x0) {
          iVar17 = 0;
          pMVar18 = pMVar27;
          do {
            iVar17 = iVar17 + 1;
            pMVar18 = pMVar18->next;
          } while (pMVar18 != (MatchData *)0x0);
        }
        if (pTVar23 != (TypeHandle *)0x0) {
          iVar30 = 0;
          pTVar28 = pTVar23;
          do {
            iVar30 = iVar30 + 1;
            pTVar28 = pTVar28->next;
          } while (pTVar28 != (TypeHandle *)0x0);
        }
        if (iVar17 == iVar30) {
          bVar16 = pTVar23 == (TypeHandle *)0x0 || pMVar27 == (MatchData *)0x0;
          pTVar28 = pTVar23;
          if (pTVar23 != (TypeHandle *)0x0 && pMVar27 != (MatchData *)0x0) {
            do {
              if (pMVar27->type != pTVar28->type) goto LAB_00161130;
              pTVar28 = pTVar28->next;
              pMVar27 = pMVar27->next;
              bVar16 = pTVar28 == (TypeHandle *)0x0 || pMVar27 == (MatchData *)0x0;
            } while (pTVar28 != (TypeHandle *)0x0 && pMVar27 != (MatchData *)0x0);
          }
          if (bVar16) {
            pTVar7 = (pFVar5->type->arguments).head;
            for (pTVar28 = (argumentType->arguments).head;
                (pTVar7 != (TypeHandle *)0x0 && (pTVar28 != (TypeHandle *)0x0));
                pTVar28 = pTVar28->next) {
              if (pTVar7->type != pTVar28->type) goto LAB_00161130;
              pTVar7 = pTVar7->next;
            }
            if (pTVar7 == pTVar28) {
              pEVar21 = local_230;
              if (pSVar6 == (ScopeData *)0x0) {
                if ((local_230 == (ExprBase *)0x0) || (local_230->typeID != 9)) {
                  __assert_fail("isType<ExprNullptrLiteral>(context)",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                ,0x1af3,
                                "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                               );
                }
                pSVar22 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
                pEVar21 = CreateFunctionContextAccess(ctx,pSVar22,pFVar5);
              }
              if (((proto.function)->instances).count <= (uint)uVar25) {
                __assert_fail("index < count",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                              ,0x199,
                              "T &SmallArray<FunctionData *, 8>::operator[](unsigned int) [T = FunctionData *, N = 8]"
                             );
              }
              pFVar5 = ((proto.function)->instances).data[uVar25];
              __return_storage_ptr__->source = source;
              __return_storage_ptr__->function = pFVar5;
              __return_storage_ptr__->context = pEVar21;
              if (pEVar21 == (ExprBase *)0x0) goto LAB_001618e6;
              goto LAB_00161852;
            }
          }
        }
      }
LAB_00161130:
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar31);
  }
  if ((CreateGenericFunctionInstance(ExpressionContext&,SynBase*,FunctionValue,IntrusiveList<TypeHandle>,ArrayView<ArgumentData>,bool)
       ::token == '\0') &&
     (iVar17 = __cxa_guard_acquire(&CreateGenericFunctionInstance(ExpressionContext&,SynBase*,FunctionValue,IntrusiveList<TypeHandle>,ArrayView<ArgumentData>,bool)
                                    ::token), iVar17 != 0)) {
    CreateGenericFunctionInstance::token =
         NULLC::TraceGetToken("analyze","CreateGenericFunctionInstance");
    __cxa_guard_release(&CreateGenericFunctionInstance(ExpressionContext&,SynBase*,FunctionValue,IntrusiveList<TypeHandle>,ArrayView<ArgumentData>,bool)
                         ::token);
  }
  NULLC::TraceScope::TraceScope(&local_220,CreateGenericFunctionInstance::token);
  lVar10 = NULLC::traceContext;
  pSVar3 = (proto.function)->name;
  if ((pSVar3 != (SynIdentifier *)0x0) &&
     (pLVar8 = (pSVar3->super_SynBase).begin, pLVar8 != (Lexeme *)0x0)) {
    pcVar20 = pLVar8->pos;
    uVar31 = (long)((pSVar3->super_SynBase).end)->pos - (long)pcVar20;
    iVar17 = (int)uVar31;
    if (iVar17 != 0) {
      uVar26 = iVar17 + 1;
      if ((*(uint *)(NULLC::traceContext + 0x264) <= *(int *)(NULLC::traceContext + 0x260) + uVar26)
         || (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
        NULLC::TraceDump();
      }
      if (*(uint *)(lVar10 + 0x264) <= uVar26) {
        __assert_fail("count + 1 < context.labels.max",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                      ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
      }
      uVar1 = *(uint *)(lVar10 + 0x260);
      memcpy((void *)((ulong)uVar1 + *(long *)(lVar10 + 0x268)),pcVar20,uVar31 & 0xffffffff);
      *(undefined1 *)(*(long *)(lVar10 + 0x268) + (ulong)(uint)(*(int *)(lVar10 + 0x260) + iVar17))
           = 0;
      *(int *)(lVar10 + 0x260) = *(int *)(lVar10 + 0x260) + uVar26;
      lVar9 = *(long *)(lVar10 + 0x278);
      uVar26 = *(uint *)(lVar10 + 0x270);
      *(uint *)(lVar10 + 0x270) = uVar26 + 1;
      *(uint *)(lVar9 + (ulong)uVar26 * 8) = uVar1 * 4 + 2;
      *(undefined4 *)(lVar9 + 4 + (ulong)uVar26 * 8) = 0;
    }
  }
  pSVar6 = ctx->scope;
  pSVar22 = (proto.function)->source;
  ctx->scope = (proto.function)->scope;
  ctx->lookupLocation = pSVar22;
  uVar26 = ctx->functionInstanceDepth + 1;
  ctx->functionInstanceDepth = uVar26;
  if (0x40 < uVar26) {
    anon_unknown.dwarf_c6b42::Stop
              (ctx,source,"ERROR: reached maximum generic function instance depth (%d)",0x40);
  }
  __env = ctx->errorHandler;
  memcpy(local_f8,__env,200);
  bVar16 = ctx->errorHandlerNested;
  ctx->errorHandlerNested = true;
  uVar26 = *(uint *)(NULLC::traceContext + 0x244);
  iVar17 = _setjmp((__jmp_buf_tag *)__env);
  lVar10 = NULLC::traceContext;
  if (iVar17 == 0) {
    syntax = GetGenericFunctionDefinition(ctx,source,proto.function);
    if (syntax == (SynFunctionDefinition *)0x0) {
      syntax_00 = (SynShortFunctionDefinition *)(proto.function)->declaration->source;
      if ((syntax_00 == (SynShortFunctionDefinition *)0x0) ||
         ((syntax_00->super_SynBase).typeID != 0x39)) {
        syntax_00 = (SynShortFunctionDefinition *)0x0;
      }
      if (syntax_00 == (SynShortFunctionDefinition *)0x0) {
        anon_unknown.dwarf_c6b42::Stop
                  (ctx,source,"ERROR: imported generic function call is not supported");
      }
      pEVar21 = AnalyzeShortFunctionDefinition(ctx,syntax_00,proto.function,argumentType);
    }
    else {
      matches.tail = local_248.tail;
      matches.head = local_248.head;
      pEVar21 = AnalyzeFunctionDefinition
                          (ctx,syntax,proto.function,argumentType,(TypeBase *)parentType,matches,
                           false,false,false);
    }
    ctx->functionInstanceDepth = ctx->functionInstanceDepth - 1;
    ctx->scope = pSVar6;
    ctx->lookupLocation = (SynBase *)0x0;
    memcpy(__env,local_f8,200);
    ctx->errorHandlerNested = bVar16;
    if ((pEVar21 == (ExprBase *)0x0) || (pEVar21->typeID != 0x24)) {
      pEVar21 = (ExprBase *)0x0;
    }
    if (pEVar21 == (ExprBase *)0x0) {
      __assert_fail("definition",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1b66,
                    "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
    node = *(ExprVariableDefinition **)&pEVar21[2].typeID;
    if (node != (ExprVariableDefinition *)0x0) {
      pEVar29 = (proto.function)->declaration;
      if ((pEVar29 == (ExprBase *)0x0) || (pEVar29->typeID != 0x25)) {
        pEVar29 = (ExprBase *)0x0;
      }
      if (pEVar29 == (ExprBase *)0x0) {
        uVar26 = (ctx->setup).count;
        if (uVar26 == (ctx->setup).max) {
          SmallArray<ExprBase_*,_128U>::grow(&ctx->setup,uVar26);
        }
        ppEVar13 = (ctx->setup).data;
        if (ppEVar13 == (ExprBase **)0x0) {
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<ExprBase *, 128>::push_back(const T &) [T = ExprBase *, N = 128]"
                       );
        }
        uVar26 = (ctx->setup).count;
        (ctx->setup).count = uVar26 + 1;
        ppEVar13[uVar26] = &node->super_ExprBase;
      }
      else {
        IntrusiveList<ExprVariableDefinition>::push_back
                  ((IntrusiveList<ExprVariableDefinition> *)&pEVar29[1].typeID,node);
      }
    }
    if (standalone) goto LAB_00161835;
    if (*(long *)(pEVar21[1]._vptr_ExprBase[3] + 0x20) == 0) {
      if ((proto.context == (ExprBase *)0x0) || ((proto.context)->typeID != 9)) {
        __assert_fail("isType<ExprNullptrLiteral>(context)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1b77,
                      "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                     );
      }
      pSVar22 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      proto.context =
           CreateFunctionContextAccess(ctx,pSVar22,(FunctionData *)pEVar21[1]._vptr_ExprBase);
    }
    pFVar5 = (FunctionData *)pEVar21[1]._vptr_ExprBase;
    pEVar21 = CreateSequence(ctx,source,pEVar21,proto.context);
    __return_storage_ptr__->source = source;
    __return_storage_ptr__->function = pFVar5;
    __return_storage_ptr__->context = pEVar21;
    if (pEVar21 == (ExprBase *)0x0) {
LAB_001618e6:
      __assert_fail("context",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                    ,0x289,"FunctionValue::FunctionValue(SynBase *, FunctionData *, ExprBase *)");
    }
  }
  else {
    uVar1 = *(uint *)(NULLC::traceContext + 0x244);
    while (uVar26 < uVar1) {
      NULLC::TraceLeave(0.0,0,0);
      uVar1 = *(uint *)(lVar10 + 0x244);
    }
    ctx->functionInstanceDepth = ctx->functionInstanceDepth - 1;
    ctx->scope = pSVar6;
    ctx->lookupLocation = (SynBase *)0x0;
    pcVar20 = ctx->errorBuf;
    if (pcVar20 != (char *)0x0) {
      sVar19 = strlen(pcVar20);
      local_228 = pcVar20 + sVar19;
      iVar17 = NULLC::SafeSprintf(local_228,(ulong)(ctx->errorBufSize - (int)sVar19),
                                  "while instantiating generic function %.*s(",
                                  (ulong)(uint)(*(int *)&((proto.function)->name->name).end -
                                               (int)((proto.function)->name->name).begin));
      pcVar20 = local_228 + iVar17;
      for (pTVar23 = ((proto.function)->type->arguments).head; pTVar23 != (TypeHandle *)0x0;
          pTVar23 = pTVar23->next) {
        pcVar24 = ", ";
        if (pTVar23 == ((proto.function)->type->arguments).head) {
          pcVar24 = "";
        }
        iVar17 = NULLC::SafeSprintf(pcVar20,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar20) +
                                                   ctx->errorBufSize),"%s%.*s",pcVar24,
                                    (ulong)(uint)(*(int *)&(pTVar23->type->name).end -
                                                 (int)(pTVar23->type->name).begin));
        pcVar20 = pcVar20 + iVar17;
      }
      iVar17 = NULLC::SafeSprintf(pcVar20,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar20) +
                                                 ctx->errorBufSize),")");
      pcVar20 = pcVar20 + iVar17;
      if (arguments.count != 0) {
        iVar17 = NULLC::SafeSprintf(pcVar20,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar20) +
                                                   ctx->errorBufSize),"\n  using argument(s) (");
        pcVar20 = pcVar20 + iVar17;
        if (arguments.count != 0) {
          uVar25 = 0;
          uVar31 = uVar25;
          do {
            pcVar24 = ", ";
            if (uVar31 == 0) {
              pcVar24 = "";
            }
            lVar10 = *(long *)((long)&(arguments.data)->type + uVar31);
            iVar17 = NULLC::SafeSprintf(pcVar20,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar20) +
                                                       ctx->errorBufSize),"%s%.*s",pcVar24,
                                        (ulong)(uint)(*(int *)(lVar10 + 0x18) -
                                                     (int)*(undefined8 *)(lVar10 + 0x10)));
            pcVar20 = pcVar20 + iVar17;
            uVar25 = uVar25 + 1;
            uVar31 = uVar31 + 0x30;
          } while (uVar25 < arguments.count);
        }
        iVar17 = NULLC::SafeSprintf(pcVar20,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar20) +
                                                   ctx->errorBufSize),")");
        pcVar20 = pcVar20 + iVar17;
      }
      if (local_248.head != (MatchData *)0x0) {
        iVar17 = NULLC::SafeSprintf(pcVar20,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar20) +
                                                   ctx->errorBufSize),"\n  with [");
        pcVar20 = pcVar20 + iVar17;
        for (pMVar27 = local_248.head; pMVar27 != (MatchData *)0x0; pMVar27 = pMVar27->next) {
          pcVar24 = ", ";
          if (pMVar27 == local_248.head) {
            pcVar24 = "";
          }
          pcVar11 = (pMVar27->name->name).begin;
          pcVar12 = (pMVar27->type->name).begin;
          iVar17 = NULLC::SafeSprintf(pcVar20,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar20) +
                                                     ctx->errorBufSize),"%s%.*s = %.*s",pcVar24,
                                      (ulong)(uint)(*(int *)&(pMVar27->name->name).end -
                                                   (int)pcVar11),pcVar11,
                                      *(int *)&(pMVar27->type->name).end - (int)pcVar12,pcVar12);
          pcVar20 = pcVar20 + iVar17;
        }
        iVar17 = NULLC::SafeSprintf(pcVar20,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar20) +
                                                   ctx->errorBufSize),"]");
        pcVar20 = pcVar20 + iVar17;
      }
      anon_unknown.dwarf_c6b42::AddRelatedErrorInfoWithLocation(ctx,source,local_228,pcVar20);
    }
    memcpy(__env,local_f8,200);
    ctx->errorHandlerNested = bVar16;
    if (bVar16 != false) {
      if (ctx->errorHandlerActive == false) {
        __assert_fail("ctx.errorHandlerActive",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1b52,
                      "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                     );
      }
      longjmp((__jmp_buf_tag *)__env,1);
    }
    ctx->errorCount = ctx->errorCount + 1;
LAB_00161835:
    __return_storage_ptr__->source = (SynBase *)0x0;
    __return_storage_ptr__->function = (FunctionData *)0x0;
    __return_storage_ptr__->context = (ExprBase *)0x0;
  }
  NULLC::TraceScope::~TraceScope(&local_220);
LAB_00161852:
  SmallArray<CallArgumentData,_16U>::~SmallArray(&local_210);
  return __return_storage_ptr__;
}

Assistant:

FunctionValue CreateGenericFunctionInstance(ExpressionContext &ctx, SynBase *source, FunctionValue proto, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, bool standalone)
{
	FunctionData *function = proto.function;

	SmallArray<CallArgumentData, 16> result(ctx.allocator);

	if(!PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, NULL, false))
		assert(!"unexpected");

	TypeBase *parentType = NULL;

	if(proto.context->type == ctx.typeAutoRef)
	{
		assert(function->scope->ownerType && !function->scope->ownerType->isGeneric);
		parentType = function->scope->ownerType;
	}
	else if(function->scope->ownerType)
	{
		parentType = getType<TypeRef>(proto.context->type)->subType;
	}

	if(parentType && parentType->isGeneric)
		Stop(ctx, source, "ERROR: generic type arguments required for type '%.*s'", FMT_ISTR(parentType->name));

	IntrusiveList<MatchData> aliases;

	{
		MatchData *currMatch = function->generics.head;
		TypeHandle *currGeneric = generics.head;

		for(; currMatch && currGeneric; currMatch = currMatch->next, currGeneric = currGeneric->next)
		{
			if(isType<TypeError>(currGeneric->type))
				return FunctionValue();

			aliases.push_back(new (ctx.get<MatchData>()) MatchData(currMatch->name, currGeneric->type));
		}
	}

	TypeFunction *instance = GetGenericFunctionInstanceType(ctx, source, parentType, function, result, aliases);

	if(!instance)
	{
		Report(ctx, source, "ERROR: failed to instantiate generic function '%.*s'", FMT_ISTR(function->name->name));

		return FunctionValue();
	}

	assert(!instance->isGeneric);

	// Search for an existing function
	for(unsigned i = 0; i < function->instances.size(); i++)
	{
		FunctionData *data = function->instances[i];

		if(parentType != data->scope->ownerType)
			continue;

		if(!SameGenerics(data->generics, generics))
			continue;

		if(!SameArguments(data->type, instance))
			continue;

		ExprBase *context = proto.context;

		if(!data->scope->ownerType)
		{
			assert(isType<ExprNullptrLiteral>(context));

			context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), data);
		}

		return FunctionValue(source, function->instances[i], context);
	}

	TRACE_SCOPE("analyze", "CreateGenericFunctionInstance");

	if(proto.function->name && proto.function->name->begin)
		TRACE_LABEL2(proto.function->name->begin->pos, proto.function->name->end->pos);

	// Switch to original function scope
	ScopeData *scope = ctx.scope;

	ctx.SwitchToScopeAtPoint(function->scope, function->source);

	ctx.functionInstanceDepth++;

	if(ctx.functionInstanceDepth > NULLC_MAX_GENERIC_INSTANCE_DEPTH)
		Stop(ctx, source, "ERROR: reached maximum generic function instance depth (%d)", NULLC_MAX_GENERIC_INSTANCE_DEPTH);

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	ExprBase *expr = NULL;
	
	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		if(SynFunctionDefinition *syntax = GetGenericFunctionDefinition(ctx, source, function))
			expr = AnalyzeFunctionDefinition(ctx, syntax, function, instance, parentType, aliases, false, false, false);
		else if(SynShortFunctionDefinition *node = getType<SynShortFunctionDefinition>(function->declaration->source))
			expr = AnalyzeShortFunctionDefinition(ctx, node, function, instance);
		else
			Stop(ctx, source, "ERROR: imported generic function call is not supported");
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		ctx.functionInstanceDepth--;

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		// Additional error info
		if(ctx.errorBuf)
		{
			char *errorCurr = ctx.errorBuf + strlen(ctx.errorBuf);

			const char *messageStart = errorCurr;

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "while instantiating generic function %.*s(", FMT_ISTR(function->name->name));

			for(TypeHandle *curr = function->type->arguments.head; curr; curr = curr->next)
				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s", curr != function->type->arguments.head ? ", " : "", FMT_ISTR(curr->type->name));

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), ")");

			if(!arguments.empty())
			{
				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "\n  using argument(s) (");

				for(unsigned i = 0; i < arguments.size(); i++)
					errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(arguments[i].type->name));

				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), ")");
			}

			if(!aliases.empty())
			{
				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "\n  with [");

				for(MatchData *curr = aliases.head; curr; curr = curr->next)
					errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s = %.*s", curr != aliases.head ? ", " : "", FMT_ISTR(curr->name->name), FMT_ISTR(curr->type->name));

				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "]");
			}

			const char *messageEnd = errorCurr;

			AddRelatedErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
		}

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		if(ctx.errorHandlerNested)
		{
			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}

		ctx.errorCount++;

		return FunctionValue();
	}

	ctx.functionInstanceDepth--;

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(expr);

	assert(definition);

	if(definition->contextVariableDefinition)
	{
		if(ExprGenericFunctionPrototype *genericProto = getType<ExprGenericFunctionPrototype>(function->declaration))
			genericProto->contextVariables.push_back(definition->contextVariableDefinition);
		else
			ctx.setup.push_back(definition->contextVariableDefinition);
	}

	if(standalone)
		return FunctionValue();

	ExprBase *context = proto.context;

	if(!definition->function->scope->ownerType)
	{
		assert(isType<ExprNullptrLiteral>(context));

		context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), definition->function);
	}

	return FunctionValue(source, definition->function, CreateSequence(ctx, source, definition, context));
}